

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNodes(OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  int iVar1;
  DllNodeList *__x;
  aiScene *extraout_RDX;
  aiScene *extraout_RDX_00;
  aiScene *extraout_RDX_01;
  aiScene *extraout_RDX_02;
  aiScene *extraout_RDX_03;
  aiScene *extraout_RDX_04;
  aiScene *extraout_RDX_05;
  aiScene *extraout_RDX_06;
  aiScene *extraout_RDX_07;
  aiScene *extraout_RDX_08;
  pointer ppDVar2;
  DllNodeList childs;
  vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> local_48;
  
  if (node != (DDLNode *)0x0) {
    __x = ODDLParser::DDLNode::getChildNodeList(node);
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::vector
              (&local_48,__x);
    ppDVar2 = local_48.
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        ODDLParser::DDLNode::getType_abi_cxx11_(*ppDVar2);
        iVar1 = std::__cxx11::string::compare(Grammar::MetricType_abi_cxx11_);
        if (iVar1 == 0) {
          handleMetricNode(this,*ppDVar2,extraout_RDX);
        }
        else {
          iVar1 = std::__cxx11::string::compare(Grammar::NameType_abi_cxx11_);
          if (iVar1 == 0) {
            handleNameNode(this,*ppDVar2,extraout_RDX_00);
          }
          else {
            iVar1 = std::__cxx11::string::compare(Grammar::ObjectRefType_abi_cxx11_);
            if (iVar1 == 0) {
              handleObjectRefNode(this,*ppDVar2,extraout_RDX_01);
            }
            else {
              iVar1 = std::__cxx11::string::compare(Grammar::MaterialRefType_abi_cxx11_);
              if (iVar1 == 0) {
                handleMaterialRefNode(this,*ppDVar2,extraout_RDX_02);
              }
              else {
                iVar1 = std::__cxx11::string::compare(Grammar::MetricKeyType_abi_cxx11_);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare(Grammar::GeometryNodeType_abi_cxx11_);
                  if (iVar1 == 0) {
                    handleGeometryNode(this,*ppDVar2,pScene);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare(Grammar::CameraNodeType_abi_cxx11_);
                    if (iVar1 == 0) {
                      handleCameraNode(this,*ppDVar2,pScene);
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare(Grammar::LightNodeType_abi_cxx11_);
                      if (iVar1 == 0) {
                        handleLightNode(this,*ppDVar2,pScene);
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          (Grammar::GeometryObjectType_abi_cxx11_);
                        if ((iVar1 == 0) ||
                           (iVar1 = std::__cxx11::string::compare
                                              (Grammar::CameraObjectType_abi_cxx11_), iVar1 == 0)) {
                          handleNodes(this,*ppDVar2,pScene);
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare(Grammar::LightObjectType_abi_cxx11_)
                          ;
                          if (iVar1 == 0) {
                            handleLightObject(this,*ppDVar2,pScene);
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare(Grammar::TransformType_abi_cxx11_)
                            ;
                            if (iVar1 == 0) {
                              handleTransformNode(this,*ppDVar2,extraout_RDX_03);
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare(Grammar::MeshType_abi_cxx11_);
                              if (iVar1 == 0) {
                                handleMeshNode(this,*ppDVar2,pScene);
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare
                                                  (Grammar::VertexArrayType_abi_cxx11_);
                                if (iVar1 == 0) {
                                  handleVertexArrayNode(this,*ppDVar2,extraout_RDX_04);
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare
                                                    (Grammar::IndexArrayType_abi_cxx11_);
                                  if (iVar1 == 0) {
                                    handleIndexArrayNode(this,*ppDVar2,extraout_RDX_05);
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare
                                                      (Grammar::MaterialType_abi_cxx11_);
                                    if (iVar1 == 0) {
                                      handleMaterialNode(this,*ppDVar2,pScene);
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare
                                                        (Grammar::ColorType_abi_cxx11_);
                                      if (iVar1 == 0) {
                                        handleColorNode(this,*ppDVar2,extraout_RDX_06);
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare
                                                          (Grammar::ParamType_abi_cxx11_);
                                        if (iVar1 == 0) {
                                          handleParamNode(this,*ppDVar2,extraout_RDX_07);
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare
                                                            (Grammar::TextureType_abi_cxx11_);
                                          if (iVar1 == 0) {
                                            handleTextureNode(this,*ppDVar2,extraout_RDX_08);
                                          }
                                          else {
                                            std::__cxx11::string::compare
                                                      (Grammar::AttenType_abi_cxx11_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        ppDVar2 = ppDVar2 + 1;
      } while (ppDVar2 !=
               local_48.
               super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNodes( DDLNode *node, aiScene *pScene ) {
    if( nullptr == node ) {
        return;
    }

    DDLNode::DllNodeList childs = node->getChildNodeList();
    for( DDLNode::DllNodeList::iterator it = childs.begin(); it != childs.end(); ++it ) {
        Grammar::TokenType tokenType( Grammar::matchTokenType( ( *it )->getType().c_str() ) );
        switch( tokenType ) {
            case Grammar::MetricToken:
                handleMetricNode( *it, pScene );
                break;

            case Grammar::NameToken:
                handleNameNode( *it, pScene );
                break;

            case Grammar::ObjectRefToken:
                handleObjectRefNode( *it, pScene );
                break;

            case Grammar::MaterialRefToken:
                handleMaterialRefNode( *it, pScene );
                break;

            case Grammar::MetricKeyToken:
                break;

            case Grammar::GeometryNodeToken:
                handleGeometryNode( *it, pScene );
                break;

            case Grammar::CameraNodeToken:
                handleCameraNode( *it, pScene );
                break;

            case Grammar::LightNodeToken:
                handleLightNode( *it, pScene );
                break;

            case Grammar::GeometryObjectToken:
                handleGeometryObject( *it, pScene );
                break;

            case Grammar::CameraObjectToken:
                handleCameraObject( *it, pScene );
                break;

            case Grammar::LightObjectToken:
                handleLightObject( *it, pScene );
                break;

            case Grammar::TransformToken:
                handleTransformNode( *it, pScene );
                break;

            case Grammar::MeshToken:
                handleMeshNode( *it, pScene );
                break;

            case Grammar::VertexArrayToken:
                handleVertexArrayNode( *it, pScene );
                break;

            case Grammar::IndexArrayToken:
                handleIndexArrayNode( *it, pScene );
                break;

            case Grammar::MaterialToken:
                handleMaterialNode( *it, pScene );
                break;

            case Grammar::ColorToken:
                handleColorNode( *it, pScene );
                break;

            case Grammar::ParamToken:
                handleParamNode( *it, pScene );
                break;

            case Grammar::TextureToken:
                handleTextureNode( *it, pScene );
                break;

            default:
                break;
        }
    }
}